

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableBase.cpp
# Opt level: O2

Dims * __thiscall
adios2::core::VariableBase::Shape(Dims *__return_storage_ptr__,VariableBase *this,size_t step)

{
  Engine *pEVar1;
  int iVar2;
  undefined4 extraout_var;
  const_iterator cVar3;
  Dims *__x;
  key_type local_40;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"Shape",(allocator *)&local_40);
  CheckRandomAccess(this,step,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  pEVar1 = this->m_Engine;
  if (pEVar1 != (Engine *)0x0) {
    (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar2 = (*pEVar1->_vptr_Engine[0xd])(pEVar1,this,step,__return_storage_ptr__);
    if ((char)iVar2 != '\0') {
      return __return_storage_ptr__;
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&__return_storage_ptr__->
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  if (((step != 0xffffffffffffffff || this->m_FirstStreamingStep != true) &&
      (this->m_Engine != (Engine *)0x0)) && (this->m_ShapeID == GlobalArray)) {
    if (this->m_FirstStreamingStep == false) {
      iVar2 = (*this->m_Engine->_vptr_Engine[4])();
      step = CONCAT44(extraout_var,iVar2);
    }
    local_40 = step + 1;
    cVar3 = std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
            ::find(&(this->m_AvailableShapes)._M_t,&local_40);
    if ((_Rb_tree_header *)cVar3._M_node !=
        &(this->m_AvailableShapes)._M_t._M_impl.super__Rb_tree_header) {
      __x = (Dims *)&cVar3._M_node[1]._M_parent;
      goto LAB_00455363;
    }
  }
  __x = &this->m_Shape;
LAB_00455363:
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(__return_storage_ptr__,__x);
  return __return_storage_ptr__;
}

Assistant:

Dims VariableBase::Shape(const size_t step) const
{
    CheckRandomAccess(step, "Shape");

    if (m_Engine)
    {
        Dims tmp;
        // see if the engine implements Variable Shape inquiry
        if (m_Engine->VarShape(*this, step, tmp))
            return tmp;
    }
    if (m_FirstStreamingStep && step == adios2::EngineCurrentStep)
    {
        return m_Shape;
    }

    if (m_Engine != nullptr && m_ShapeID == ShapeID::GlobalArray)
    {
        const size_t stepInput = !m_FirstStreamingStep ? m_Engine->CurrentStep() : step;

        const auto it = m_AvailableShapes.find(stepInput + 1);
        if (it != m_AvailableShapes.end())
        {
            return it->second;
        }
    }
    return m_Shape;
}